

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::AllocateSharedDataItems
          (CSharedMemoryObject *this,SHMPTR *pshmObjData,SHMObjData **ppsmod)

{
  PalObjectTypeId PVar1;
  DWORD DVar2;
  SHMPTR shmptr;
  SHMObjData *__s;
  WCHAR *string;
  SHMPTR SVar3;
  SHMObjData *psmod;
  SHMPTR shmod;
  PAL_ERROR palError;
  SHMObjData **ppsmod_local;
  SHMPTR *pshmObjData_local;
  CSharedMemoryObject *this_local;
  
  shmod._4_4_ = 0;
  if (pshmObjData == (SHMPTR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x134);
    fprintf(_stderr,"Expression: NULL != pshmObjData\n");
  }
  if (ppsmod == (SHMObjData **)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x135);
    fprintf(_stderr,"Expression: NULL != ppsmod\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  SHMLock();
  shmptr = SHMalloc(0x48);
  if (shmptr == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    shmod._4_4_ = 0xe;
  }
  else {
    __s = (SHMObjData *)SHMPtrToPtr(shmptr);
    if (__s == (SHMObjData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x14e);
      fprintf(_stderr,"Expression: NULL != psmod\n");
    }
    memset(__s,0,0x48);
    PVar1 = CObjectType::GetId((this->super_CPalObjectBase).m_pot);
    __s->eTypeId = PVar1;
    __s->lProcessRefCount = 1;
    DVar2 = CPalString::GetStringLength(&(this->super_CPalObjectBase).m_oa.sObjectName);
    if (DVar2 != 0) {
      DVar2 = CPalString::GetStringLength(&(this->super_CPalObjectBase).m_oa.sObjectName);
      __s->dwNameLength = DVar2;
      string = CPalString::GetString(&(this->super_CPalObjectBase).m_oa.sObjectName);
      SVar3 = SHMWStrDup(string);
      __s->shmObjName = SVar3;
      if (__s->shmObjName == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        shmod._4_4_ = 0xe;
        goto LAB_003b129e;
      }
    }
    DVar2 = CObjectType::GetImmutableDataSize((this->super_CPalObjectBase).m_pot);
    if (DVar2 != 0) {
      DVar2 = CObjectType::GetImmutableDataSize((this->super_CPalObjectBase).m_pot);
      SVar3 = SHMalloc((ulong)DVar2);
      __s->shmObjImmutableData = SVar3;
      if (__s->shmObjImmutableData == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        shmod._4_4_ = 0xe;
        goto LAB_003b129e;
      }
    }
    DVar2 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
    if (DVar2 != 0) {
      DVar2 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
      SVar3 = SHMalloc((ulong)DVar2);
      __s->shmObjSharedData = SVar3;
      if (__s->shmObjSharedData == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        shmod._4_4_ = 0xe;
        goto LAB_003b129e;
      }
    }
    *pshmObjData = shmptr;
    *ppsmod = __s;
  }
LAB_003b129e:
  if ((shmod._4_4_ != 0) && (shmptr != 0)) {
    FreeSharedDataAreas(shmptr);
  }
  SHMRelease();
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return shmod._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::AllocateSharedDataItems(
    SHMPTR *pshmObjData,
    SHMObjData **ppsmod
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmod = SHMNULL;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pshmObjData);
    _ASSERTE(NULL != ppsmod);

    ENTRY("CSharedMemoryObject::AllocateSharedDataItems"
        "(this = %p, pshmObjData = %p, ppsmod = %p)\n",
        this,
        pshmObjData,
        ppsmod
        );
        
    //
    // We're about to make a number of shared memory allocations,
    // so grab the lock for the entirety of the routine.
    //

    SHMLock();

    shmod = SHMalloc(sizeof(SHMObjData));
    if (SHMNULL == shmod)
    {
        ERROR("Unable to allocate m_shmod for new object\n");
        palError = ERROR_OUTOFMEMORY;
        goto AllocateSharedDataItemsExit;
    }

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmod);
    _ASSERTE(NULL != psmod);

    ZeroMemory(psmod, sizeof(*psmod));

    psmod->eTypeId = m_pot->GetId();
    psmod->lProcessRefCount = 1;

    if (0 != m_oa.sObjectName.GetStringLength())
    {
        psmod->dwNameLength = m_oa.sObjectName.GetStringLength();
        psmod->shmObjName = SHMWStrDup(m_oa.sObjectName.GetString());
        if (SHMNULL == psmod->shmObjName)
        {
            ERROR("Unable to allocate psmod->shmObjName for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    if (0 != m_pot->GetImmutableDataSize())
    {
        //
        // The shared copy of the object's immutable data will be initialized
        // by CSharedMemoryObjectManager::RegisterObject or PromoteSharedData
        //
        
        psmod->shmObjImmutableData = SHMalloc(m_pot->GetImmutableDataSize());
        if (SHMNULL == psmod->shmObjImmutableData)
        {
            ERROR("Unable to allocate psmod->shmObjImmutableData for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    if (0 != m_pot->GetSharedDataSize())
    {
        psmod->shmObjSharedData = SHMalloc(m_pot->GetSharedDataSize());
        if (SHMNULL == psmod->shmObjSharedData)
        {
            ERROR("Unable to allocate psmod->shmObjSharedData for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    *pshmObjData = shmod;
    *ppsmod = psmod;

AllocateSharedDataItemsExit:

    if (NO_ERROR != palError && SHMNULL != shmod)
    {
        FreeSharedDataAreas(shmod);
    }

    SHMRelease();

    LOGEXIT("CSharedMemoryObject::AllocateSharedDataItems returns %d\n", palError);

    return palError;
}